

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_mask.hpp
# Opt level: O2

void __thiscall duckdb::ValidityArray::Pack(ValidityArray *this,ValidityMask *mask,idx_t count)

{
  bool *pbVar1;
  unsigned_long *puVar2;
  idx_t j;
  long lVar3;
  long lVar4;
  ulong uVar5;
  bool *pbVar6;
  idx_t i;
  ulong uVar7;
  validity_t entry;
  ulong uVar8;
  
  if (this->validity_mask != (bool *)0x0) {
    TemplatedValidityMask<unsigned_long>::Initialize
              (&mask->super_TemplatedValidityMask<unsigned_long>,count);
    puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    pbVar1 = this->validity_mask;
    lVar4 = 0;
    pbVar6 = pbVar1;
    for (uVar7 = 0; uVar7 != count >> 6; uVar7 = uVar7 + 1) {
      uVar8 = 0;
      for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 1) {
        uVar5 = 1L << ((byte)lVar3 & 0x3f);
        if (pbVar6[lVar3] == false) {
          uVar5 = 0;
        }
        uVar8 = uVar8 | uVar5;
      }
      lVar4 = lVar4 + 0x40;
      *puVar2 = uVar8;
      puVar2 = puVar2 + 1;
      pbVar6 = pbVar6 + 0x40;
    }
    if ((count & 0x3f) != 0) {
      uVar8 = 0;
      for (uVar7 = 0; (count & 0x3f) != uVar7; uVar7 = uVar7 + 1) {
        uVar5 = 1L << ((byte)uVar7 & 0x3f);
        if (pbVar1[uVar7 + lVar4] == false) {
          uVar5 = 0;
        }
        uVar8 = uVar8 | uVar5;
      }
      *puVar2 = uVar8;
    }
    return;
  }
  TemplatedValidityMask<unsigned_long>::Reset
            (&mask->super_TemplatedValidityMask<unsigned_long>,count);
  return;
}

Assistant:

inline void Pack(ValidityMask &mask, const idx_t count) const {
		if (AllValid()) {
			mask.Reset(count);
			return;
		}
		mask.Initialize(count);

		const auto entire_entries = count / ValidityMask::BITS_PER_VALUE;
		const auto ragged = count % ValidityMask::BITS_PER_VALUE;
		auto bits = mask.GetData();
		idx_t row_idx = 0;
		for (idx_t i = 0; i < entire_entries; ++i) {
			validity_t entry = 0;
			for (idx_t j = 0; j < ValidityMask::BITS_PER_VALUE; ++j) {
				if (RowIsValidUnsafe(row_idx++)) {
					entry |= validity_t(1) << j;
				}
			}
			*bits++ = entry;
		}
		if (ragged) {
			validity_t entry = 0;
			for (idx_t j = 0; j < ragged; ++j) {
				if (RowIsValidUnsafe(row_idx++)) {
					entry |= validity_t(1) << j;
				}
			}
			*bits++ = entry;
		}
	}